

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O1

vec4 __thiscall vera::Triangle::getColor(Triangle *this,vec3 *_barycenter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Material *pMVar14;
  pointer pvVar15;
  pointer pvVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar20;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar22;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar23;
  vec4 vVar24;
  undefined4 uStack_74;
  string local_68;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  vec2 local_30;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar21;
  
  pMVar14 = this->material;
  if (pMVar14 != (Material *)0x0) {
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"diffuse","");
    bVar17 = Material::haveProperty(pMVar14,&local_68);
    uStack_74 = in_XMM1_Dd;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
      uStack_74 = in_XMM1_Dd;
    }
    if (bVar17) {
      pMVar14 = this->material;
      if ((this->m_texCoords).
          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->m_texCoords).
          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"diffuse","");
        vVar24 = Material::getColor(pMVar14,&local_68);
        local_48._0_4_ = vVar24.field_2;
        aVar21 = vVar24.field_3;
        aVar20 = vVar24.field_0;
        aVar23 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)vVar24.field_1;
      }
      else {
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"diffuse","");
        pvVar15 = (this->m_texCoords).
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        fVar18 = pvVar15[2].field_0.x * (_barycenter->field_2).z +
                 pvVar15[1].field_0.x * (_barycenter->field_1).y +
                 (pvVar15->field_0).x * (_barycenter->field_0).x;
        _local_48 = ZEXT416((uint)fVar18);
        fVar22 = (_barycenter->field_2).z * pvVar15[2].field_1.y +
                 (_barycenter->field_1).y * pvVar15[1].field_1.y +
                 (_barycenter->field_0).x * (pvVar15->field_1).y;
        fVar18 = floorf(fVar18);
        fVar19 = floorf(fVar22);
        uStack_74 = 0;
        local_30.field_1.y = fVar22 - fVar19;
        local_30.field_0.x = (float)local_48._0_4_ - fVar18;
        vVar24 = Material::getColor(pMVar14,&local_68,&local_30);
        local_48._0_4_ = vVar24.field_2;
        aVar21 = vVar24.field_3;
        aVar20 = vVar24.field_0;
        aVar23 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)vVar24.field_1;
        in_XMM1_Dc = local_48._4_4_;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        local_48._4_4_ = aVar21;
        uStack_40 = in_XMM1_Dc;
        uStack_3c = uStack_74;
        operator_delete(local_68._M_dataplus._M_p);
        aVar21 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_48._4_4_;
      }
      goto LAB_00252327;
    }
  }
  pvVar16 = (this->m_colors).
            super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar16 ==
      (this->m_colors).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    aVar20.x = 1.0;
    aVar23.w = 1.0;
    local_48._0_4_ = aVar20.x;
    aVar21.w = aVar23.w;
  }
  else {
    uVar2 = pvVar16->field_0;
    uVar8 = pvVar16->field_1;
    uVar3 = pvVar16->field_2;
    uVar9 = pvVar16->field_3;
    uVar4 = pvVar16[1].field_0;
    uVar10 = pvVar16[1].field_1;
    uVar5 = pvVar16[1].field_2;
    uVar11 = pvVar16[1].field_3;
    fVar18 = (_barycenter->field_0).x;
    fVar19 = (_barycenter->field_1).y;
    fVar22 = (_barycenter->field_2).z;
    uVar6 = pvVar16[2].field_0;
    uVar12 = pvVar16[2].field_1;
    uVar7 = pvVar16[2].field_2;
    uVar13 = pvVar16[2].field_3;
    aVar20.x = fVar22 * (float)uVar6 + fVar19 * (float)uVar4 + fVar18 * (float)uVar2;
    aVar23.w = (float)uVar12 * fVar22 + (float)uVar10 * fVar19 + (float)uVar8 * fVar18;
    local_48._0_4_ = fVar22 * (float)uVar7 + fVar19 * (float)uVar5 + fVar18 * (float)uVar3;
    aVar21.w = (float)uVar13 * fVar22 + (float)uVar11 * fVar19 + (float)uVar9 * fVar18;
  }
LAB_00252327:
  vVar24.field_1.y = aVar23.w;
  vVar24.field_0 = aVar20;
  vVar24.field_3 = aVar21;
  vVar24.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)local_48._0_4_;
  return vVar24;
}

Assistant:

glm::vec4 Triangle::getColor(const glm::vec3& _barycenter) const {
    if (material != nullptr) {
        if ( material->haveProperty("diffuse") ) {
            if (haveTexCoords())
                return material->getColor("diffuse", glm::fract( getTexCoord(_barycenter) ) );
            else
                return material->getColor("diffuse");
        }
    }

    if (haveColors())
        return  getColor(0) * _barycenter.x +
                getColor(1) * _barycenter.y +
                getColor(2) * _barycenter.z;
    else
        return glm::vec4(1.0f);
}